

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::SerializeGltfBuffer
               (Buffer *buffer,json *o,string *binFilename,string *binBaseFilename)

{
  bool bVar1;
  char cVar2;
  size_type number;
  long lVar3;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  string *local_30;
  string *binBaseFilename_local;
  string *binFilename_local;
  json *o_local;
  Buffer *buffer_local;
  
  local_30 = binBaseFilename;
  binBaseFilename_local = binFilename;
  binFilename_local = (string *)o;
  o_local = (json *)buffer;
  bVar1 = SerializeGltfBufferData(&buffer->data,binFilename);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"byteLength",&local_51);
    number = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(o_local + 2));
    SerializeNumberProperty<unsigned_long>(&local_50,number,(json *)binFilename_local);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"uri",&local_89);
    SerializeStringProperty(&local_88,local_30,(json *)binFilename_local);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
      SerializeStringProperty(&local_b0,(string *)o_local,(json *)binFilename_local);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    }
    cVar2 = Value::Type((Value *)&o_local[5].m_value);
    if (cVar2 != '\0') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d8,"extras",&local_d9);
      SerializeValue(&local_d8,(Value *)&o_local[5].m_value,(json *)binFilename_local);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    buffer_local._7_1_ = true;
  }
  else {
    buffer_local._7_1_ = false;
  }
  return buffer_local._7_1_;
}

Assistant:

static bool SerializeGltfBuffer(Buffer &buffer, json &o,
                                const std::string &binFilename,
                                const std::string &binBaseFilename) {
  if (!SerializeGltfBufferData(buffer.data, binFilename)) return false;
  SerializeNumberProperty("byteLength", buffer.data.size(), o);
  SerializeStringProperty("uri", binBaseFilename, o);

  if (buffer.name.size()) SerializeStringProperty("name", buffer.name, o);

  if (buffer.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", buffer.extras, o);
  }
  return true;
}